

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O2

void __thiscall
lzham::task_pool::task_pool(task_pool *this,lzham_malloc_context malloc_context,uint num_threads)

{
  int iVar1;
  
  tsstack<lzham::task_pool::task,_64U>::tsstack(&this->m_task_stack,malloc_context);
  this->m_num_threads = 0;
  semaphore::semaphore(&this->m_tasks_available,0,0x7fff,(char *)0x0);
  this->m_malloc_context = malloc_context;
  this->m_num_outstanding_tasks = 0;
  this->m_exit_flag = 0;
  memset(this->m_threads,0,0x200);
  iVar1 = init(this,(EVP_PKEY_CTX *)(ulong)num_threads);
  if ((char)iVar1 == '\0') {
    lzham_assert("status",
                 "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.cpp"
                 ,0x2d);
  }
  return;
}

Assistant:

task_pool::task_pool(lzham_malloc_context malloc_context, uint num_threads) :
      m_task_stack(malloc_context),
      m_num_threads(0),
      m_tasks_available(0, 32767),
      m_malloc_context(malloc_context),
      m_num_outstanding_tasks(0),
      m_exit_flag(false)
   {
      utils::zero_object(m_threads);

      bool status = init(num_threads);
      LZHAM_VERIFY(status);
   }